

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cCMYK,cBGRA,bReverseSubtract>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  EBlend EVar2;
  FSpecialColormap *pFVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  BYTE BVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  byte bVar16;
  
  pFVar3 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_00645fa3_caseD_0:
    if (0 < count) {
      pbVar8 = pin + 3;
      lVar4 = 0;
      do {
        iVar5 = (uint)(byte)(*pbVar8 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)*pbVar8 >> 8)) *
                inf->alpha + (uint)pout[lVar4 * 4 + 2] * -0x10000;
        if (iVar5 >> 0x10 < 1) {
          iVar5 = 0;
        }
        pout[lVar4 * 4 + 2] = (BYTE)((uint)iVar5 >> 0x10);
        iVar5 = (uint)(byte)(*pbVar8 - (char)((0x100 - (uint)pbVar8[-2]) * (uint)*pbVar8 >> 8)) *
                inf->alpha + (uint)pout[lVar4 * 4 + 1] * -0x10000;
        if (iVar5 >> 0x10 < 1) {
          iVar5 = 0;
        }
        pout[lVar4 * 4 + 1] = (BYTE)((uint)iVar5 >> 0x10);
        iVar5 = (uint)(byte)(*pbVar8 - (char)((0x100 - (uint)pbVar8[-1]) * (uint)*pbVar8 >> 8)) *
                inf->alpha + (uint)pout[lVar4 * 4] * -0x10000;
        if (iVar5 >> 0x10 < 1) {
          iVar5 = 0;
        }
        pout[lVar4 * 4] = (BYTE)((uint)iVar5 >> 0x10);
        pout[lVar4 * 4 + 3] = 0xff;
        lVar4 = lVar4 + 1;
        pbVar8 = pbVar8 + step;
      } while (count != (int)lVar4);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_00645fa3_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pbVar8 = pin + 3;
        lVar4 = 0;
        do {
          bVar16 = *pbVar8;
          bVar11 = bVar16 - (char)((0x100 - (uint)pbVar8[-1]) * (uint)bVar16 >> 8);
          uVar12 = (uint)(byte)(bVar16 - (char)((0x100 - (uint)pbVar8[-2]) * (uint)bVar16 >> 8)) *
                   0x8f + (uint)(byte)(bVar16 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar16 >>
                                                      8)) * 0x4d +
                   ((uint)bVar11 + (uint)bVar11 * 8) * 4 >> 0xc;
          iVar5 = (uint)IcePalette[uVar12][0] * inf->alpha + (uint)pout[lVar4 * 4 + 2] * -0x10000;
          BVar10 = (BYTE)((uint)iVar5 >> 0x10);
          if (iVar5 >> 0x10 < 1) {
            BVar10 = '\0';
          }
          pout[lVar4 * 4 + 2] = BVar10;
          iVar5 = (uint)IcePalette[uVar12][1] * inf->alpha + (uint)pout[lVar4 * 4 + 1] * -0x10000;
          BVar10 = (BYTE)((uint)iVar5 >> 0x10);
          if (iVar5 >> 0x10 < 1) {
            BVar10 = '\0';
          }
          pout[lVar4 * 4 + 1] = BVar10;
          iVar5 = (uint)IcePalette[uVar12][2] * inf->alpha + (uint)pout[lVar4 * 4] * -0x10000;
          BVar10 = (BYTE)((uint)iVar5 >> 0x10);
          if (iVar5 >> 0x10 < 1) {
            BVar10 = '\0';
          }
          pout[lVar4 * 4] = BVar10;
          pout[lVar4 * 4 + 3] = 0xff;
          lVar4 = lVar4 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar4);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pbVar8 = pin + 3;
        lVar4 = 0;
        do {
          bVar16 = *pbVar8;
          iVar5 = inf->blendcolor[3];
          bVar11 = pbVar8[-2];
          iVar7 = inf->blendcolor[1];
          bVar1 = pbVar8[-1];
          iVar13 = inf->blendcolor[2];
          iVar15 = ((uint)(byte)(bVar16 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar16 >> 8)) *
                    iVar5 + inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar4 * 4 + 2] * -0x10000;
          BVar10 = (BYTE)((uint)iVar15 >> 0x10);
          if (iVar15 >> 0x10 < 1) {
            BVar10 = '\0';
          }
          pout[lVar4 * 4 + 2] = BVar10;
          iVar7 = ((uint)(byte)(bVar16 - (char)((0x100 - (uint)bVar11) * (uint)bVar16 >> 8)) * iVar5
                   + iVar7 >> 0x10 & 0xff) * inf->alpha + (uint)pout[lVar4 * 4 + 1] * -0x10000;
          BVar10 = (BYTE)((uint)iVar7 >> 0x10);
          if (iVar7 >> 0x10 < 1) {
            BVar10 = '\0';
          }
          pout[lVar4 * 4 + 1] = BVar10;
          iVar5 = ((uint)(byte)(bVar16 - (char)((0x100 - (uint)bVar1) * (uint)bVar16 >> 8)) * iVar5
                   + iVar13 >> 0x10 & 0xff) * inf->alpha + (uint)pout[lVar4 * 4] * -0x10000;
          BVar10 = (BYTE)((uint)iVar5 >> 0x10);
          if (iVar5 >> 0x10 < 1) {
            BVar10 = '\0';
          }
          pout[lVar4 * 4] = BVar10;
          pout[lVar4 * 4 + 3] = 0xff;
          lVar4 = lVar4 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar4);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pbVar8 = pin + 3;
        lVar4 = 0;
        do {
          bVar16 = *pbVar8;
          bVar11 = pbVar8[-2];
          iVar5 = inf->blendcolor[1];
          bVar1 = pbVar8[-1];
          iVar7 = inf->blendcolor[2];
          iVar13 = ((uint)(byte)(bVar16 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar16 >> 8)) *
                    inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar4 * 4 + 2] * -0x10000;
          BVar10 = (BYTE)((uint)iVar13 >> 0x10);
          if (iVar13 >> 0x10 < 1) {
            BVar10 = '\0';
          }
          pout[lVar4 * 4 + 2] = BVar10;
          iVar5 = ((uint)(byte)(bVar16 - (char)((0x100 - (uint)bVar11) * (uint)bVar16 >> 8)) * iVar5
                   >> 0x10 & 0xff) * inf->alpha + (uint)pout[lVar4 * 4 + 1] * -0x10000;
          BVar10 = (BYTE)((uint)iVar5 >> 0x10);
          if (iVar5 >> 0x10 < 1) {
            BVar10 = '\0';
          }
          pout[lVar4 * 4 + 1] = BVar10;
          iVar5 = ((uint)(byte)(bVar16 - (char)((0x100 - (uint)bVar1) * (uint)bVar16 >> 8)) * iVar7
                   >> 0x10 & 0xff) * inf->alpha + (uint)pout[lVar4 * 4] * -0x10000;
          BVar10 = (BYTE)((uint)iVar5 >> 0x10);
          if (iVar5 >> 0x10 < 1) {
            BVar10 = '\0';
          }
          pout[lVar4 * 4] = BVar10;
          pout[lVar4 * 4 + 3] = 0xff;
          lVar4 = lVar4 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar4);
      }
      break;
    default:
      EVar2 = inf->blend;
      lVar4 = (long)EVar2;
      if (lVar4 < 0x21) {
        if ((BLEND_ICEMAP < EVar2) && (0 < count)) {
          iVar5 = 0x20 - EVar2;
          pbVar8 = pin + 3;
          lVar4 = 0;
          do {
            bVar16 = *pbVar8;
            uVar14 = (uint)(byte)(bVar16 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar16 >> 8));
            uVar12 = (uint)(byte)(bVar16 - (char)((0x100 - (uint)pbVar8[-2]) * (uint)bVar16 >> 8));
            bVar16 = bVar16 - (char)((0x100 - (uint)pbVar8[-1]) * (uint)bVar16 >> 8);
            iVar13 = (uVar12 * 0x8f + uVar14 * 0x4d + ((uint)bVar16 + (uint)bVar16 * 8) * 4 >> 8) *
                     (EVar2 + BLEND_MODULATE);
            iVar15 = uVar14 * iVar5 + iVar13;
            iVar7 = uVar12 * iVar5 + iVar13;
            iVar13 = (uint)bVar16 * iVar5 + iVar13;
            iVar15 = ((uint)((ulong)((long)iVar15 * 0x84210843) >> 0x24) - (iVar15 >> 0x1f) & 0xff)
                     * inf->alpha + (uint)pout[lVar4 * 4 + 2] * -0x10000;
            BVar10 = (BYTE)((uint)iVar15 >> 0x10);
            if (iVar15 >> 0x10 < 1) {
              BVar10 = '\0';
            }
            pout[lVar4 * 4 + 2] = BVar10;
            iVar7 = ((uint)((ulong)((long)iVar7 * 0x84210843) >> 0x24) - (iVar7 >> 0x1f) & 0xff) *
                    inf->alpha + (uint)pout[lVar4 * 4 + 1] * -0x10000;
            BVar10 = (BYTE)((uint)iVar7 >> 0x10);
            if (iVar7 >> 0x10 < 1) {
              BVar10 = '\0';
            }
            pout[lVar4 * 4 + 1] = BVar10;
            iVar7 = ((uint)((ulong)((long)iVar13 * 0x84210843) >> 0x24) - (iVar13 >> 0x1f) & 0xff) *
                    inf->alpha + (uint)pout[lVar4 * 4] * -0x10000;
            BVar10 = (BYTE)((uint)iVar7 >> 0x10);
            if (iVar7 >> 0x10 < 1) {
              BVar10 = '\0';
            }
            pout[lVar4 * 4] = BVar10;
            pout[lVar4 * 4 + 3] = 0xff;
            lVar4 = lVar4 + 1;
            pbVar8 = pbVar8 + step;
          } while (count != (int)lVar4);
        }
      }
      else if (0 < count) {
        pbVar8 = pin + 3;
        lVar9 = 0;
        do {
          bVar16 = *pbVar8;
          bVar11 = bVar16 - (char)((0x100 - (uint)pbVar8[-1]) * (uint)bVar16 >> 8);
          uVar6 = (ulong)((uint)(byte)(bVar16 - (char)((0x100 - (uint)pbVar8[-2]) * (uint)bVar16 >>
                                                      8)) * 0x8f +
                          (uint)(byte)(bVar16 - (char)((0x100 - (uint)pbVar8[-3]) * (uint)bVar16 >>
                                                      8)) * 0x4d +
                          ((uint)bVar11 + (uint)bVar11 * 8) * 4 >> 8);
          bVar16 = *(byte *)((long)pFVar3 + uVar6 * 4 + lVar4 * 0x518 + -0xa700);
          bVar11 = *(byte *)((long)pFVar3 + uVar6 * 4 + lVar4 * 0x518 + -0xa6ff);
          iVar5 = (uint)*(byte *)((long)pFVar3 + uVar6 * 4 + lVar4 * 0x518 + -0xa6fe) * inf->alpha +
                  (uint)pout[lVar9 * 4 + 2] * -0x10000;
          BVar10 = (BYTE)((uint)iVar5 >> 0x10);
          if (iVar5 >> 0x10 < 1) {
            BVar10 = '\0';
          }
          pout[lVar9 * 4 + 2] = BVar10;
          iVar5 = (uint)bVar11 * inf->alpha + (uint)pout[lVar9 * 4 + 1] * -0x10000;
          BVar10 = (BYTE)((uint)iVar5 >> 0x10);
          if (iVar5 >> 0x10 < 1) {
            BVar10 = '\0';
          }
          pout[lVar9 * 4 + 1] = BVar10;
          iVar5 = (uint)bVar16 * inf->alpha + (uint)pout[lVar9 * 4] * -0x10000;
          BVar10 = (BYTE)((uint)iVar5 >> 0x10);
          if (iVar5 >> 0x10 < 1) {
            BVar10 = '\0';
          }
          pout[lVar9 * 4] = BVar10;
          pout[lVar9 * 4 + 3] = 0xff;
          lVar9 = lVar9 + 1;
          pbVar8 = pbVar8 + step;
        } while (count != (int)lVar9);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}